

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_SetButcherTables(ARKodeMem ark_mem)

{
  ARKodeButcherTable pAVar1;
  ARKodeMem in_RDI;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeARKStepMem step_mem;
  int itable;
  int etable;
  ARKODE_ERKTableID in_stack_000000ac;
  ARKODE_DIRKTableID in_stack_0000010c;
  long local_30;
  long local_28;
  void *local_20;
  int local_18;
  int local_14;
  ARKodeMem local_10;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x88d,"arkStep_SetButcherTables",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    local_20 = in_RDI->step_mem;
    if ((*(long *)((long)local_20 + 0x68) == 0) && (*(long *)((long)local_20 + 0x70) == 0)) {
      local_18 = -1;
      local_14 = -1;
      local_10 = in_RDI;
      if ((*(int *)((long)local_20 + 0x1c) == 0) || (*(int *)((long)local_20 + 0x20) == 0)) {
        if (*(int *)((long)local_20 + 0x20) == 0) {
          switch(*(undefined4 *)((long)local_20 + 0x58)) {
          case 1:
            local_18 = 0x16;
            break;
          case 2:
            local_14 = 0;
            break;
          case 3:
            local_14 = 1;
            break;
          case 4:
            local_14 = 3;
            break;
          case 5:
            local_14 = 6;
            break;
          case 6:
            local_14 = 10;
            break;
          case 7:
            local_14 = 0x13;
            break;
          case 8:
            local_14 = 0xb;
            break;
          case 9:
            local_14 = 0x15;
            break;
          default:
            arkProcessError(in_RDI,-0x16,0x8db,"arkStep_SetButcherTables",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                            ,"No explicit method at requested order, using q=9.");
            local_14 = 0x15;
          }
        }
        else {
          switch(*(undefined4 *)((long)local_20 + 0x58)) {
          case 1:
            local_18 = 0x7c;
            break;
          case 2:
            local_18 = 100;
            break;
          case 3:
            local_18 = 0x68;
            break;
          case 4:
            local_18 = 0x6b;
            break;
          case 5:
            local_18 = 0x6f;
            break;
          default:
            arkProcessError(in_RDI,-0x16,0x8c5,"arkStep_SetButcherTables",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                            ,"No implicit method at requested order, using q=5.");
            local_18 = 0x6f;
          }
        }
      }
      else {
        switch(*(undefined4 *)((long)local_20 + 0x58)) {
        case 2:
          local_14 = 0xf;
          local_18 = 0x7b;
          break;
        case 3:
          local_14 = 2;
          local_18 = 0x68;
          break;
        case 4:
          local_14 = 4;
          local_18 = 0x6d;
          break;
        case 5:
          local_14 = 9;
          local_18 = 0x6f;
          break;
        default:
          arkProcessError(in_RDI,-0x16,0x8b2,"arkStep_SetButcherTables",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                          ,"No ImEx method at requested order, using q=5.");
          local_14 = 9;
          local_18 = 0x6f;
        }
      }
      if (-1 < local_14) {
        pAVar1 = ARKodeButcherTable_LoadERK(in_stack_000000ac);
        *(ARKodeButcherTable *)((long)local_20 + 0x68) = pAVar1;
      }
      if (-1 < local_18) {
        pAVar1 = ARKodeButcherTable_LoadDIRK(in_stack_0000010c);
        *(ARKodeButcherTable *)((long)local_20 + 0x70) = pAVar1;
      }
      ARKodeButcherTable_Space(*(ARKodeButcherTable *)((long)local_20 + 0x68),&local_30,&local_28);
      local_10->liw = local_30 + local_10->liw;
      local_10->lrw = local_28 + local_10->lrw;
      ARKodeButcherTable_Space(*(ARKodeButcherTable *)((long)local_20 + 0x70),&local_30,&local_28);
      local_10->liw = local_30 + local_10->liw;
      local_10->lrw = local_28 + local_10->lrw;
      if (*(long *)((long)local_20 + 0x68) != 0) {
        *(undefined4 *)((long)local_20 + 100) =
             *(undefined4 *)(*(long *)((long)local_20 + 0x68) + 8);
        *(undefined4 *)((long)local_20 + 0x58) = **(undefined4 **)((long)local_20 + 0x68);
        *(undefined4 *)((long)local_20 + 0x5c) =
             *(undefined4 *)(*(long *)((long)local_20 + 0x68) + 4);
      }
      if (*(long *)((long)local_20 + 0x70) != 0) {
        *(undefined4 *)((long)local_20 + 100) =
             *(undefined4 *)(*(long *)((long)local_20 + 0x70) + 8);
        *(undefined4 *)((long)local_20 + 0x58) = **(undefined4 **)((long)local_20 + 0x70);
        *(undefined4 *)((long)local_20 + 0x5c) =
             *(undefined4 *)(*(long *)((long)local_20 + 0x70) + 4);
      }
      local_4 = 0;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arkStep_SetButcherTables(ARKodeMem ark_mem)
{
  int etable, itable;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* if tables have already been specified, just return */
  if ((step_mem->Be != NULL) || (step_mem->Bi != NULL))
  {
    return (ARK_SUCCESS);
  }

  /* initialize table numbers to illegal values */
  etable = itable = -1;

  /**** ImEx methods ****/
  if (step_mem->explicit && step_mem->implicit)
  {
    switch (step_mem->q)
    {
    case (2):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_2;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_2;
      break;
    case (3):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_3;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_3;
      break;
    case (4):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_4;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_4;
      break;
    case (5):
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_5;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_5;
      break;
    default: /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "No ImEx method at requested order, using q=5.");
      etable = ARKSTEP_DEFAULT_ARK_ETABLE_5;
      itable = ARKSTEP_DEFAULT_ARK_ITABLE_5;
      break;
    }

    /**** implicit methods ****/
  }
  else if (step_mem->implicit)
  {
    switch (step_mem->q)
    {
    case (1): itable = ARKSTEP_DEFAULT_DIRK_1; break;
    case (2): itable = ARKSTEP_DEFAULT_DIRK_2; break;
    case (3): itable = ARKSTEP_DEFAULT_DIRK_3; break;
    case (4): itable = ARKSTEP_DEFAULT_DIRK_4; break;
    case (5): itable = ARKSTEP_DEFAULT_DIRK_5; break;
    default: /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "No implicit method at requested order, using q=5.");
      itable = ARKSTEP_DEFAULT_DIRK_5;
      break;
    }

    /**** explicit methods ****/
  }
  else
  {
    switch (step_mem->q)
    {
    case (1): itable = ARKSTEP_DEFAULT_ERK_1; break;
    case (2): etable = ARKSTEP_DEFAULT_ERK_2; break;
    case (3): etable = ARKSTEP_DEFAULT_ERK_3; break;
    case (4): etable = ARKSTEP_DEFAULT_ERK_4; break;
    case (5): etable = ARKSTEP_DEFAULT_ERK_5; break;
    case (6): etable = ARKSTEP_DEFAULT_ERK_6; break;
    case (7): etable = ARKSTEP_DEFAULT_ERK_7; break;
    case (8): etable = ARKSTEP_DEFAULT_ERK_8; break;
    case (9): etable = ARKSTEP_DEFAULT_ERK_9; break;
    default: /* no available method, set default */
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "No explicit method at requested order, using q=9.");
      etable = ARKSTEP_DEFAULT_ERK_9;
      break;
    }
  }

  if (etable > -1) { step_mem->Be = ARKodeButcherTable_LoadERK(etable); }
  if (itable > -1) { step_mem->Bi = ARKodeButcherTable_LoadDIRK(itable); }

  /* note Butcher table space requirements */
  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  /* set [redundant] ARK stored values for stage numbers and method orders */
  if (step_mem->Be != NULL)
  {
    step_mem->stages = step_mem->Be->stages;
    step_mem->q      = step_mem->Be->q;
    step_mem->p      = step_mem->Be->p;
  }
  if (step_mem->Bi != NULL)
  {
    step_mem->stages = step_mem->Bi->stages;
    step_mem->q      = step_mem->Bi->q;
    step_mem->p      = step_mem->Bi->p;
  }

  return (ARK_SUCCESS);
}